

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dump2XYZCmd.cpp
# Opt level: O2

int cmdline_parser_dump(FILE *outfile,gengetopt_args_info *args_info)

{
  char **in_RCX;
  int iVar1;
  
  if (outfile == (FILE *)0x0) {
    fprintf(_stderr,"%s: cannot dump options to stream\n","Dump2XYZ");
    iVar1 = 1;
  }
  else {
    if (args_info->help_given != 0) {
      fprintf((FILE *)outfile,"%s\n","help");
    }
    if (args_info->version_given != 0) {
      fprintf((FILE *)outfile,"%s\n","version");
    }
    if (args_info->input_given != 0) {
      write_into_file(outfile,"input",args_info->input_orig,in_RCX);
    }
    if (args_info->output_given != 0) {
      write_into_file(outfile,"output",args_info->output_orig,in_RCX);
    }
    if (args_info->frame_given != 0) {
      write_into_file(outfile,"frame",args_info->frame_orig,in_RCX);
    }
    if (args_info->water_given != 0) {
      fprintf((FILE *)outfile,"%s\n","water");
    }
    if (args_info->periodicBox_given != 0) {
      fprintf((FILE *)outfile,"%s\n","periodicBox");
    }
    if (args_info->zconstraint_given != 0) {
      fprintf((FILE *)outfile,"%s\n","zconstraint");
    }
    if (args_info->rigidbody_given != 0) {
      fprintf((FILE *)outfile,"%s\n","rigidbody");
    }
    if (args_info->watertype_given != 0) {
      fprintf((FILE *)outfile,"%s\n","watertype");
    }
    if (args_info->selection_given != 0) {
      write_into_file(outfile,"selection",args_info->selection_orig,in_RCX);
    }
    if (args_info->originsele_given != 0) {
      write_into_file(outfile,"originsele",args_info->originsele_orig,in_RCX);
    }
    if (args_info->refsele_given != 0) {
      write_into_file(outfile,"refsele",args_info->refsele_orig,in_RCX);
    }
    if (args_info->repeatX_given != 0) {
      write_into_file(outfile,"repeatX",args_info->repeatX_orig,in_RCX);
    }
    if (args_info->repeatY_given != 0) {
      write_into_file(outfile,"repeatY",args_info->repeatY_orig,in_RCX);
    }
    if (args_info->repeatZ_given != 0) {
      write_into_file(outfile,"repeatZ",args_info->repeatZ_orig,in_RCX);
    }
    if (args_info->basetype_given != 0) {
      fprintf((FILE *)outfile,"%s\n","basetype");
    }
    if (args_info->velocities_given != 0) {
      fprintf((FILE *)outfile,"%s\n","velocities");
    }
    if (args_info->forces_given != 0) {
      fprintf((FILE *)outfile,"%s\n","forces");
    }
    if (args_info->vectors_given != 0) {
      fprintf((FILE *)outfile,"%s\n","vectors");
    }
    if (args_info->charges_given != 0) {
      fprintf((FILE *)outfile,"%s\n","charges");
    }
    if (args_info->efield_given != 0) {
      fprintf((FILE *)outfile,"%s\n","efield");
    }
    if (args_info->globalID_given == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = 0;
      fprintf((FILE *)outfile,"%s\n","globalID");
    }
  }
  return iVar1;
}

Assistant:

int
cmdline_parser_dump(FILE *outfile, struct gengetopt_args_info *args_info)
{
  int i = 0;

  if (!outfile)
    {
      fprintf (stderr, "%s: cannot dump options to stream\n", CMDLINE_PARSER_PACKAGE);
      return EXIT_FAILURE;
    }

  if (args_info->help_given)
    write_into_file(outfile, "help", 0, 0 );
  if (args_info->version_given)
    write_into_file(outfile, "version", 0, 0 );
  if (args_info->input_given)
    write_into_file(outfile, "input", args_info->input_orig, 0);
  if (args_info->output_given)
    write_into_file(outfile, "output", args_info->output_orig, 0);
  if (args_info->frame_given)
    write_into_file(outfile, "frame", args_info->frame_orig, 0);
  if (args_info->water_given)
    write_into_file(outfile, "water", 0, 0 );
  if (args_info->periodicBox_given)
    write_into_file(outfile, "periodicBox", 0, 0 );
  if (args_info->zconstraint_given)
    write_into_file(outfile, "zconstraint", 0, 0 );
  if (args_info->rigidbody_given)
    write_into_file(outfile, "rigidbody", 0, 0 );
  if (args_info->watertype_given)
    write_into_file(outfile, "watertype", 0, 0 );
  if (args_info->selection_given)
    write_into_file(outfile, "selection", args_info->selection_orig, 0);
  if (args_info->originsele_given)
    write_into_file(outfile, "originsele", args_info->originsele_orig, 0);
  if (args_info->refsele_given)
    write_into_file(outfile, "refsele", args_info->refsele_orig, 0);
  if (args_info->repeatX_given)
    write_into_file(outfile, "repeatX", args_info->repeatX_orig, 0);
  if (args_info->repeatY_given)
    write_into_file(outfile, "repeatY", args_info->repeatY_orig, 0);
  if (args_info->repeatZ_given)
    write_into_file(outfile, "repeatZ", args_info->repeatZ_orig, 0);
  if (args_info->basetype_given)
    write_into_file(outfile, "basetype", 0, 0 );
  if (args_info->velocities_given)
    write_into_file(outfile, "velocities", 0, 0 );
  if (args_info->forces_given)
    write_into_file(outfile, "forces", 0, 0 );
  if (args_info->vectors_given)
    write_into_file(outfile, "vectors", 0, 0 );
  if (args_info->charges_given)
    write_into_file(outfile, "charges", 0, 0 );
  if (args_info->efield_given)
    write_into_file(outfile, "efield", 0, 0 );
  if (args_info->globalID_given)
    write_into_file(outfile, "globalID", 0, 0 );
  

  i = EXIT_SUCCESS;
  return i;
}